

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

iterator * __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::iterator
::operator++(iterator *this)

{
  ControlBlock *pCVar1;
  runtime_type<> *i_target_type;
  void *i_target_address;
  runtime_type<> *type;
  iterator *this_local;
  
  pCVar1 = next_valid(this->m_queue,this->m_control);
  this->m_control = pCVar1;
  if (this->m_control != (ControlBlock *)0x0) {
    i_target_type =
         heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         type_after_control(this->m_control);
    i_target_address =
         heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         get_element(this->m_control);
    dynamic_reference<density::runtime_type<>,_(density::cv_qual)0>::dynamic_reference
              (&(this->m_value).m_pair,i_target_type,i_target_address);
  }
  return this;
}

Assistant:

iterator & operator++() noexcept
            {
                DENSITY_ASSUME(m_queue != nullptr);
                m_control = m_queue->next_valid(m_control);
                if (m_control != nullptr)
                {
                    RUNTIME_TYPE & type = *type_after_control(m_control);
                    new (&m_value.m_pair) value_type(type, get_element(m_control));
                }
                return *this;
            }